

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gulcalc.cpp
# Opt level: O1

void __thiscall
gulcalc::output_mean
          (gulcalc *this,OASIS_FLOAT tiv,prob_mean *pp,int bin_count,OASIS_FLOAT *gul_mean,
          OASIS_FLOAT *std_dev,OASIS_FLOAT *max_loss)

{
  float fVar1;
  long lVar2;
  OASIS_FLOAT OVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  
  *gul_mean = 0.0;
  *std_dev = 0.0;
  fVar4 = 0.0;
  if (0 < bin_count) {
    OVar3 = *gul_mean;
    fVar5 = 0.0;
    lVar2 = 0;
    do {
      fVar6 = 0.0;
      if ((int)lVar2 != 0) {
        fVar6 = fVar5;
      }
      fVar5 = pp[lVar2].prob_to;
      fVar1 = pp[lVar2].bin_mean;
      fVar6 = (fVar5 - fVar6) * fVar1;
      OVar3 = OVar3 + fVar6 * tiv;
      *gul_mean = OVar3;
      fVar4 = fVar4 + fVar1 * fVar6 * tiv * tiv;
      lVar2 = lVar2 + 1;
    } while (bin_count != (int)lVar2);
  }
  fVar4 = fVar4 - *gul_mean * *gul_mean;
  fVar5 = 0.0;
  if (0.0 <= fVar4) {
    fVar5 = fVar4;
  }
  if (fVar5 < 0.0) {
    OVar3 = sqrtf(fVar5);
  }
  else {
    OVar3 = SQRT(fVar5);
  }
  *std_dev = OVar3;
  *max_loss = tiv * (this->damagebindictionary_vec_->
                    super__Vector_base<damagebindictionary,_std::allocator<damagebindictionary>_>).
                    _M_impl.super__Vector_impl_data._M_start[(long)bin_count + -1].bin_to;
  return;
}

Assistant:

void gulcalc::output_mean(OASIS_FLOAT tiv, prob_mean *pp, int bin_count,
			  OASIS_FLOAT &gul_mean,  OASIS_FLOAT &std_dev,
			  OASIS_FLOAT &max_loss)
{
	OASIS_FLOAT last_prob_to = 0;
	gul_mean = 0;
	std_dev = 0;
	OASIS_FLOAT ctr_var = 0;

	for (int bin_index = 0; bin_index < bin_count; bin_index++)
	{
		probrec p;
		if (bin_index == 0) {
			p.prob_from = 0;
		} else {
			p.prob_from = last_prob_to;
		}
		p.prob_to = pp->prob_to;
		p.bin_mean = pp->bin_mean;
		last_prob_to = pp->prob_to;
		gul_mean = gul_mean + ((p.prob_to - p.prob_from) *p.bin_mean * tiv);
		ctr_var = ctr_var + ((p.prob_to - p.prob_from) *p.bin_mean*p.bin_mean * tiv * tiv);
		pp++;
	}
	OASIS_FLOAT g2 = gul_mean * gul_mean;
	std_dev = ctr_var - g2;
	if (std_dev < 0) std_dev  = 0;
	std_dev = sqrt(std_dev);

	max_loss = tiv * (*damagebindictionary_vec_)[bin_count - 1].bin_to;
}